

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialSums.h
# Opt level: O2

void __thiscall
bwtil::PartialSums::incrementFrom
          (PartialSums *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *nodes,
          ulint node_nr,uint i)

{
  ulong uVar1;
  reference pvVar2;
  ulong uVar3;
  
  if (i == 0) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    uVar3 = ~(-1L << ((ulong)((uint)this->log2n * (this->d - i)) & 0x3f));
  }
  uVar1 = this->ones;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(nodes,node_nr);
  *pvVar2 = *pvVar2 + (uVar3 & uVar1);
  return;
}

Assistant:

inline void incrementFrom(vector<ulint> * nodes, ulint node_nr, uint i){

	#ifdef DEBUG
		if(empty){
			cout << "ERROR (PartialSums): incrementFrom() called on empty counter\n";
			exit(0);
		}
	#endif

	#ifdef DEBUG
		if(i>d){
			cout << "ERROR (PartialSums): incrementing counter i>d (" << i << ">" << d << ")\n";
			exit(0);
		}
	#endif

		ulint MASK = ~((ulint)0);

		if(i>0) MASK = ((ulint)1<<((d-i)*log2n))-1;

		//printWord(MASK&ones);

		nodes->at(node_nr) += (MASK&ones);

	}